

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid_Iterator.h
# Opt level: O0

void __thiscall Nova::Grid_Iterator<float,_3>::Next_Helper(Grid_Iterator<float,_3> *this)

{
  int iVar1;
  int *piVar2;
  int local_14;
  int i;
  Grid_Iterator<float,_3> *this_local;
  
  piVar2 = Vector<int,_3,_true>::operator()(&(this->region).min_corner,2);
  iVar1 = *piVar2;
  piVar2 = Vector<int,_3,_true>::operator()(&this->index,2);
  *piVar2 = iVar1;
  local_14 = 1;
  while( true ) {
    if (local_14 < 0) {
      Reset(this,this->current_region + 1);
      return;
    }
    piVar2 = Vector<int,_3,_true>::operator()(&this->index,local_14);
    iVar1 = *piVar2;
    piVar2 = Vector<int,_3,_true>::operator()(&(this->region).max_corner,local_14);
    if (iVar1 < *piVar2) break;
    piVar2 = Vector<int,_3,_true>::operator()(&(this->region).min_corner,local_14);
    iVar1 = *piVar2;
    piVar2 = Vector<int,_3,_true>::operator()(&this->index,local_14);
    *piVar2 = iVar1;
    local_14 = local_14 + -1;
  }
  piVar2 = Vector<int,_3,_true>::operator()(&this->index,local_14);
  *piVar2 = *piVar2 + 1;
  return;
}

Assistant:

void Next_Helper()
    {
        index(d-1)=region.min_corner(d-1);
        for(int i=d-2;i>=0;--i)
        {
            if(index(i)<region.max_corner(i)){++index(i);return;}
            index(i)=region.min_corner(i);
        }
        Reset(current_region+1);
    }